

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QOscMessage>::copyAppend
          (QGenericArrayOps<QOscMessage> *this,QOscMessage *b,QOscMessage *e)

{
  qsizetype *pqVar1;
  QOscMessage *pQVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QOscMessage>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QOscMessage>).size;
      pQVar2[lVar3].m_isValid = b->m_isValid;
      pDVar4 = (b->m_addressPattern).d.d;
      pQVar2[lVar3].m_addressPattern.d.d = pDVar4;
      pQVar2[lVar3].m_addressPattern.d.ptr = (b->m_addressPattern).d.ptr;
      pQVar2[lVar3].m_addressPattern.d.size = (b->m_addressPattern).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar5 = (b->m_arguments).d.d;
      pQVar2[lVar3].m_arguments.d.d = pDVar5;
      pQVar2[lVar3].m_arguments.d.ptr = (b->m_arguments).d.ptr;
      pQVar2[lVar3].m_arguments.d.size = (b->m_arguments).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QOscMessage>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }